

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

void __thiscall
chrono::ChLoad<MyLoaderPointStiff>::CreateJacobianMatrices(ChLoad<MyLoaderPointStiff> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_28;
  
  if (*(long *)&this->field_0x38 == 0) {
    puVar2 = (undefined8 *)operator_new(0x80);
    *puVar2 = 0x13b4e0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[8] = 0;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    puVar2[0xb] = 0;
    puVar2[0xc] = 0;
    puVar2[0xd] = 0;
    puVar2[0xe] = 0;
    puVar2[0xf] = 0;
    *(undefined8 **)&this->field_0x38 = puVar2;
    local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
    local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar3 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      peVar3 = (element_type *)0x0;
    }
    else {
      peVar3 = peVar3 + *(long *)(*(long *)peVar3 + -0x78);
    }
    this_00 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
              super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (**(code **)(*(long *)peVar3 + 0x60))(peVar3,&local_48);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    uVar1 = *(undefined8 *)&this->field_0x38;
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              (&local_28,&local_48);
    chrono::ChLoadJacobians::SetVariables(uVar1,&local_28);
    if (local_28.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::CreateJacobianMatrices() {
    if (!this->jacobians) {
        // create jacobian structure
        this->jacobians = new ChLoadJacobians;
        // set variables forsparse KRM block
        std::vector<ChVariables*> mvars;
        loader.GetLoadable()->LoadableGetVariables(mvars);
        this->jacobians->SetVariables(mvars);
    }
}